

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

string * __thiscall
pbrt::DiffuseAreaLight::ToString_abi_cxx11_(string *__return_storage_ptr__,DiffuseAreaLight *this)

{
  Image *args_6;
  ShapeHandle local_40;
  string local_38;
  
  args_6 = (Image *)0x3716d4;
  LightBase::BaseToString_abi_cxx11_(&local_38,&this->super_LightBase);
  local_40.
  super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
  .bits = (TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
           )0x445853;
  if (this->twoSided != false) {
    local_40.
    super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
    .bits = (TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
             )0x2cf90ec;
  }
  StringPrintf<std::__cxx11::string,pbrt::DenselySampledSpectrum_const&,float_const&,pbrt::ShapeHandle_const&,char_const*,float_const&,pbrt::Image_const&>
            (__return_storage_ptr__,
             (pbrt *)
             "[ DiffuseAreaLight %s Lemit: %s scale: %f shape: %s twoSided: %s area: %f image: %s ]"
             ,(char *)&local_38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->Lemit,
             (DenselySampledSpectrum *)&this->scale,(float *)&this->shape,&local_40,
             (char **)&this->area,(float *)&this->image,args_6);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string DiffuseAreaLight::ToString() const {
    return StringPrintf("[ DiffuseAreaLight %s Lemit: %s scale: %f shape: %s "
                        "twoSided: %s area: %f image: %s ]",
                        BaseToString(), Lemit, scale, shape, twoSided ? "true" : "false",
                        area, image);
}